

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_ae8::ndiSSTATHelper(ndicapi *pol,char *command,char *commandReply)

{
  char *pcVar1;
  unsigned_long uVar2;
  
  uVar2 = ndiHexToUnsignedLong(command + 6,4);
  if ((uVar2 & 1) != 0) {
    pol->SstatControl[0] = *commandReply;
    pcVar1 = commandReply + 1;
    commandReply = commandReply + 2;
    pol->SstatControl[1] = *pcVar1;
  }
  if ((uVar2 & 2) != 0) {
    pol->SstatSensor[0] = *commandReply;
    pcVar1 = commandReply + 1;
    commandReply = commandReply + 2;
    pol->SstatSensor[1] = *pcVar1;
  }
  if ((uVar2 & 4) != 0) {
    pol->SstatTiu[0] = *commandReply;
    pol->SstatTiu[1] = commandReply[1];
  }
  return;
}

Assistant:

void ndiSSTATHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode;
    char* writePointer;

    // read the SSTAT command reply mode
    mode = ndiHexToUnsignedLong(&command[6], 4);

    if (mode & NDI_CONTROL)
    {
      writePointer = pol->SstatControl;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }

    if (mode & NDI_SENSORS)
    {
      writePointer = pol->SstatSensor;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }

    if (mode & NDI_TIU)
    {
      writePointer = pol->SstatTiu;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }
  }